

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O1

gchar * array_free(GRealArray *array,ArrayFreeFlags flags)

{
  uint uVar1;
  guint8 *pgVar2;
  
  if ((flags & FREE_SEGMENT) == 0) {
    pgVar2 = array->data;
  }
  else {
    if ((array->clear_func != (GDestroyNotify)0x0) && (array->len != 0)) {
      uVar1 = 0;
      do {
        (*array->clear_func)(array->data + array->elt_size * uVar1);
        uVar1 = uVar1 + 1;
      } while (uVar1 < array->len);
    }
    g_free(array->data);
    pgVar2 = (guint8 *)0x0;
  }
  if ((flags & PRESERVE_WRAPPER) == 0) {
    g_slice_free1(0x20,array);
  }
  else {
    array->data = (guint8 *)0x0;
    array->len = 0;
    array->alloc = 0;
  }
  return (gchar *)pgVar2;
}

Assistant:

static gchar *array_free (GRealArray *array, ArrayFreeFlags flags)
{
    gchar *segment;

    if (flags & FREE_SEGMENT)
    {
        if (array->clear_func != NULL)
        {
            guint i;

            for (i = 0; i < array->len; i++)
                array->clear_func (g_array_elt_pos (array, i));
        }

        g_free (array->data);
        segment = NULL;
    }
    else
        segment = (gchar*) array->data;

    if (flags & PRESERVE_WRAPPER)
    {
        array->data            = NULL;
        array->len             = 0;
        array->alloc           = 0;
    }
    else
    {
        g_slice_free1 (sizeof (GRealArray), array);
    }

    return segment;
}